

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLElement.cpp
# Opt level: O0

string * __thiscall iDynTree::XMLElement::description_abi_cxx11_(XMLElement *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pXVar3;
  string *in_RDI;
  shared_ptr<iDynTree::XMLElement> *child;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  *__range1_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>
  *attribute;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
  *__range1;
  ostringstream str;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
  *in_stack_fffffffffffffd68;
  __normal_iterator<std::shared_ptr<iDynTree::XMLElement>_*,_std::vector<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
  *in_stack_fffffffffffffd70;
  XMLElement *in_stack_fffffffffffffd78;
  string local_238 [32];
  string local_218 [32];
  reference local_1f8;
  shared_ptr<iDynTree::XMLElement> *local_1f0;
  __normal_iterator<std::shared_ptr<iDynTree::XMLElement>_*,_std::vector<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
  local_1e8;
  vector<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  *local_1e0;
  string local_1d8 [32];
  reference local_1b8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_true>
  local_1b0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_true>
  local_1a8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
  *local_1a0;
  ostringstream local_188 [176];
  XMLAttribute *in_stack_ffffffffffffff28;
  XMLElement *in_stack_ffffffffffffffe8;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar2 = std::operator<<((ostream *)local_188,"<");
  pXVar3 = std::
           unique_ptr<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
           ::operator->((unique_ptr<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
                         *)0x132309);
  std::operator<<(poVar2,(string *)&pXVar3->m_name);
  pXVar3 = std::
           unique_ptr<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
           ::operator->((unique_ptr<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
                         *)0x13232d);
  local_1a0 = &pXVar3->m_attributes;
  local_1a8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
       ::begin(in_stack_fffffffffffffd68);
  local_1b0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
       ::end(in_stack_fffffffffffffd68);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_1a8,&local_1b0);
    if (!bVar1) break;
    local_1b8 = std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_false,_true>
                ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_false,_true>
                             *)0x132390);
    poVar2 = std::operator<<((ostream *)local_188," ");
    std::__shared_ptr_access<iDynTree::XMLAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<iDynTree::XMLAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1323c4);
    XMLAttribute::description_abi_cxx11_(in_stack_ffffffffffffff28);
    std::operator<<(poVar2,local_1d8);
    std::__cxx11::string::~string(local_1d8);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_false,_true>
                  *)in_stack_fffffffffffffd70);
  }
  poVar2 = std::operator<<((ostream *)local_188,">");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pXVar3 = std::
           unique_ptr<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
           ::operator->((unique_ptr<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
                         *)0x132484);
  local_1e0 = &pXVar3->m_children;
  local_1e8._M_current =
       (shared_ptr<iDynTree::XMLElement> *)
       std::
       vector<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
       ::begin((vector<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
                *)in_stack_fffffffffffffd68);
  local_1f0 = (shared_ptr<iDynTree::XMLElement> *)
              std::
              vector<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
              ::end((vector<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
                     *)in_stack_fffffffffffffd68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffd70,
                       (__normal_iterator<std::shared_ptr<iDynTree::XMLElement>_*,_std::vector<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
                        *)in_stack_fffffffffffffd68);
    if (!bVar1) break;
    local_1f8 = __gnu_cxx::
                __normal_iterator<std::shared_ptr<iDynTree::XMLElement>_*,_std::vector<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
                ::operator*(&local_1e8);
    std::__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1324fc);
    description_abi_cxx11_(in_stack_ffffffffffffffe8);
    poVar2 = std::operator<<((ostream *)local_188,local_218);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_218);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<iDynTree::XMLElement>_*,_std::vector<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
    ::operator++(&local_1e8);
  }
  getParsedTextContent_abi_cxx11_(in_stack_fffffffffffffd78);
  std::operator<<((ostream *)local_188,local_238);
  std::__cxx11::string::~string(local_238);
  poVar2 = std::operator<<((ostream *)local_188,"</");
  pXVar3 = std::
           unique_ptr<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
           ::operator->((unique_ptr<iDynTree::XMLElement::XMLElementPimpl,_std::default_delete<iDynTree::XMLElement::XMLElementPimpl>_>
                         *)0x1325da);
  poVar2 = std::operator<<(poVar2,(string *)&pXVar3->m_name);
  poVar2 = std::operator<<(poVar2,">");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string XMLElement::description() const
    {
        std::ostringstream str;
        str << "<" << m_pimpl->m_name;
        for (const auto& attribute : m_pimpl->m_attributes) {
            str << " " << attribute.second->description();
        }
        str << ">" << std::endl;
        for (const auto& child : m_pimpl->m_children) {
            str << child->description() << std::endl;
        }
        str << getParsedTextContent();
        str << "</" << m_pimpl->m_name << ">" << std::endl;
        return str.str();
    }